

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaDefragmentationContext_T::DefragmentPassBegin
          (VmaDefragmentationContext_T *this,VmaDefragmentationPassMoveInfo *moveInfo)

{
  bool bVar1;
  size_t sVar2;
  VmaDefragmentationMove *pVVar3;
  int *in_RSI;
  long in_RDI;
  VmaBlockVector *unaff_retaddr;
  VmaDefragmentationContext_T *in_stack_00000008;
  VmaMutexLockWrite lock_1;
  uint32_t i;
  VmaMutexLockWrite lock;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  VmaBlockVector *in_stack_ffffffffffffff60;
  VmaDeviceMemoryBlock *in_stack_ffffffffffffff68;
  VmaBlockVector *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  uint local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  VkResult VVar4;
  
  if (*(long *)(in_RDI + 0x48) == 0) {
    for (local_30 = 0; local_30 < *(uint *)(in_RDI + 0x40); local_30 = local_30 + 1) {
      if (*(long *)(*(long *)(in_RDI + 0x50) + (ulong)local_30 * 8) != 0) {
        VmaBlockVector::GetMutex
                  (*(VmaBlockVector **)(*(long *)(in_RDI + 0x50) + (ulong)local_30 * 8));
        VmaBlockVector::GetAllocator
                  (*(VmaBlockVector **)(*(long *)(in_RDI + 0x50) + (ulong)local_30 * 8));
        VmaMutexLockWrite::VmaMutexLockWrite
                  ((VmaMutexLockWrite *)in_stack_ffffffffffffff70,
                   (VmaRWMutex *)in_stack_ffffffffffffff68,
                   SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
        sVar2 = VmaBlockVector::GetBlockCount((VmaBlockVector *)0x2f884f);
        if (sVar2 < 2) {
          in_stack_ffffffffffffff70 =
               (VmaBlockVector *)VmaBlockVector::GetBlockCount((VmaBlockVector *)0x2f88d1);
          if (in_stack_ffffffffffffff70 == (VmaBlockVector *)0x1) {
            in_stack_ffffffffffffff60 =
                 *(VmaBlockVector **)(*(long *)(in_RDI + 0x50) + (ulong)local_30 * 8);
            in_stack_ffffffffffffff68 =
                 VmaBlockVector::GetBlock
                           (in_stack_ffffffffffffff60,
                            CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
            in_stack_ffffffffffffff5f =
                 ReallocWithinBlock(in_stack_00000008,unaff_retaddr,
                                    (VmaDeviceMemoryBlock *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
            if ((bool)in_stack_ffffffffffffff5f) {
              bVar1 = true;
              goto LAB_002f8943;
            }
          }
LAB_002f893b:
          bVar1 = false;
        }
        else {
          in_stack_ffffffffffffff7f =
               ComputeDefragmentation
                         ((VmaDefragmentationContext_T *)
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
          if (!(bool)in_stack_ffffffffffffff7f) goto LAB_002f893b;
          bVar1 = true;
        }
LAB_002f8943:
        VmaMutexLockWrite::~VmaMutexLockWrite((VmaMutexLockWrite *)in_stack_ffffffffffffff60);
        if (bVar1) break;
      }
    }
  }
  else {
    VmaBlockVector::GetMutex(*(VmaBlockVector **)(in_RDI + 0x48));
    VmaBlockVector::GetAllocator(*(VmaBlockVector **)(in_RDI + 0x48));
    VmaMutexLockWrite::VmaMutexLockWrite
              ((VmaMutexLockWrite *)in_stack_ffffffffffffff70,
               (VmaRWMutex *)in_stack_ffffffffffffff68,
               SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
    sVar2 = VmaBlockVector::GetBlockCount((VmaBlockVector *)0x2f8709);
    if (sVar2 < 2) {
      sVar2 = VmaBlockVector::GetBlockCount((VmaBlockVector *)0x2f8762);
      if (sVar2 == 1) {
        VmaBlockVector::GetBlock
                  (in_stack_ffffffffffffff60,
                   CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        ReallocWithinBlock(in_stack_00000008,unaff_retaddr,
                           (VmaDeviceMemoryBlock *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      }
    }
    else {
      ComputeDefragmentation
                ((VmaDefragmentationContext_T *)
                 CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                 in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    }
    VmaMutexLockWrite::~VmaMutexLockWrite((VmaMutexLockWrite *)in_stack_ffffffffffffff60);
  }
  sVar2 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::size
                    ((VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *)
                     (in_RDI + 0x18));
  *in_RSI = (int)sVar2;
  if (*in_RSI == 0) {
    in_RSI[2] = 0;
    in_RSI[3] = 0;
    VVar4 = VK_SUCCESS;
  }
  else {
    pVVar3 = VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::data
                       ((VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>
                         *)(in_RDI + 0x18));
    *(VmaDefragmentationMove **)(in_RSI + 2) = pVVar3;
    VVar4 = VK_INCOMPLETE;
  }
  return VVar4;
}

Assistant:

VkResult VmaDefragmentationContext_T::DefragmentPassBegin(VmaDefragmentationPassMoveInfo& moveInfo)
{
    if (m_PoolBlockVector != VMA_NULL)
    {
        VmaMutexLockWrite lock(m_PoolBlockVector->GetMutex(), m_PoolBlockVector->GetAllocator()->m_UseMutex);

        if (m_PoolBlockVector->GetBlockCount() > 1)
            ComputeDefragmentation(*m_PoolBlockVector, 0);
        else if (m_PoolBlockVector->GetBlockCount() == 1)
            ReallocWithinBlock(*m_PoolBlockVector, m_PoolBlockVector->GetBlock(0));
    }
    else
    {
        for (uint32_t i = 0; i < m_BlockVectorCount; ++i)
        {
            if (m_pBlockVectors[i] != VMA_NULL)
            {
                VmaMutexLockWrite lock(m_pBlockVectors[i]->GetMutex(), m_pBlockVectors[i]->GetAllocator()->m_UseMutex);

                if (m_pBlockVectors[i]->GetBlockCount() > 1)
                {
                    if (ComputeDefragmentation(*m_pBlockVectors[i], i))
                        break;
                }
                else if (m_pBlockVectors[i]->GetBlockCount() == 1)
                {
                    if (ReallocWithinBlock(*m_pBlockVectors[i], m_pBlockVectors[i]->GetBlock(0)))
                        break;
                }
            }
        }
    }

    moveInfo.moveCount = static_cast<uint32_t>(m_Moves.size());
    if (moveInfo.moveCount > 0)
    {
        moveInfo.pMoves = m_Moves.data();
        return VK_INCOMPLETE;
    }

    moveInfo.pMoves = VMA_NULL;
    return VK_SUCCESS;
}